

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PField * __thiscall PStruct::AddField(PStruct *this,FName *name,PType *type,DWORD flags)

{
  PField *this_00;
  PSymbol *pPVar1;
  uint uVar2;
  uint uVar3;
  PField *field;
  FName local_2c;
  
  this_00 = (PField *)DObject::operator_new(0x40);
  local_2c = (FName)name->Index;
  PField::PField(this_00,&local_2c,type,flags,0,0);
  uVar2 = type->Align;
  uVar3 = -uVar2 & (*(int *)&(this->super_PNamedType).super_PCompoundType.super_PType.
                             super_PTypeBase.super_DObject.field_0x24 + uVar2) - 1;
  this_00->Offset = (ulong)uVar3;
  *(uint *)&(this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
            field_0x24 = uVar3 + *(int *)&(type->super_PTypeBase).super_DObject.field_0x24;
  uVar3 = (this->super_PNamedType).super_PCompoundType.super_PType.Align;
  if (uVar2 < uVar3) {
    uVar2 = uVar3;
  }
  (this->super_PNamedType).super_PCompoundType.super_PType.Align = uVar2;
  field = this_00;
  pPVar1 = PSymbolTable::AddSymbol
                     (&(this->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                      (PSymbol *)this_00);
  if (pPVar1 == (PSymbol *)0x0) {
    (*(this_00->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject[2])(this_00);
    field = (PField *)0x0;
  }
  else {
    TArray<PField_*,_PField_*>::Push(&this->Fields,&field);
  }
  return field;
}

Assistant:

PField *PStruct::AddField(FName name, PType *type, DWORD flags)
{
	PField *field = new PField(name, type, flags);

	// The new field is added to the end of this struct, alignment permitting.
	field->Offset = (Size + (type->Align - 1)) & ~(type->Align - 1);

	// Enlarge this struct to enclose the new field.
	Size = unsigned(field->Offset + type->Size);

	// This struct's alignment is the same as the largest alignment of any of
	// its fields.
	Align = MAX(Align, type->Align);

	if (Symbols.AddSymbol(field) == NULL)
	{ // name is already in use
		delete field;
		return NULL;
	}
	Fields.Push(field);

	return field;
}